

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::parseNextDeclaration(Parser *this,Declaration *decl)

{
  bool bVar1;
  Parser *in_RSI;
  Parser *in_RDI;
  Declaration *in_stack_ffffffffffffffd8;
  Parser *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  this_00 = in_RDI;
  bVar1 = testProperty((Parser *)0xa3bd81);
  if (bVar1) {
    bVar1 = parseProperty(this_00,(Declaration *)in_RSI);
    if (bVar1) {
      bVar1 = next(in_RSI,(TokenType)((ulong)in_RDI >> 0x20));
      if (bVar1) {
        skipSpace(in_RDI);
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa3bdd7);
        bVar1 = parseNextExpr(in_RSI,(QList<QCss::Value> *)in_RDI);
        if (bVar1) {
          bVar1 = testPrio((Parser *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
          if ((!bVar1) || (bVar1 = parsePrio(in_RDI,in_stack_ffffffffffffffd8), bVar1)) {
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        }
        else {
          bVar1 = false;
        }
      }
      else {
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Parser::parseNextDeclaration(Declaration *decl)
{
    if (!testProperty())
        return true; // not an error!
    if (!parseProperty(decl)) return false;
    if (!next(COLON)) return false;
    skipSpace();
    if (!parseNextExpr(&decl->d->values)) return false;
    if (testPrio())
        if (!parsePrio(decl)) return false;
    return true;
}